

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

size_t __thiscall
std::hash<groundupdb::HashedValue>::operator()(hash<groundupdb::HashedValue> *this,HashedValue *v)

{
  byte *vpart;
  pointer pbVar1;
  ulong uVar2;
  Bytes local_20;
  
  groundupdb::HashedValue::data(&local_20,v);
  uVar2 = 0;
  for (pbVar1 = local_20.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
      pbVar1 != local_20.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    uVar2 = uVar2 ^ (uint)*pbVar1 * 2;
  }
  if (local_20.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

size_t operator()(const groundupdb::HashedValue& v) const
        {
          std::size_t hv = 0;
          for (auto& vpart : v.data()) {
            hv = hv ^ (std::to_integer<std::size_t>(vpart) << 1);
          }
          return hv;
        }